

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_spec_constant_op_and_composite_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation
          (FoldSpecConstantOpAndCompositePass *this,inst_iterator *pos)

{
  Operand *pOVar1;
  Type *type;
  bool bVar2;
  Op opcode;
  int iVar3;
  uint32_t uVar4;
  ConstantManager *this_00;
  Type *type_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InstructionFolder *pIVar5;
  Constant *pCVar6;
  Instruction *pIVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar8;
  pointer puVar9;
  __normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  _Var10;
  __normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  __it;
  long lVar11;
  _Head_base<0UL,_spvtools::opt::analysis::Constant_*,_false> local_b8;
  Constant *rc;
  FoldSpecConstantOpAndCompositePass *local_a8;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  result_vector_components;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  operands;
  Vector *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result_vec;
  
  pIVar7 = (pos->super_iterator).node_;
  this_00 = IRContext::get_constant_mgr((this->super_Pass).context_);
  type_00 = analysis::ConstantManager::GetType(this_00,pIVar7);
  opcode = Instruction::GetSingleWordInOperand(pIVar7,0);
  rc = (Constant *)&operands;
  operands.
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  operands.
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  operands.
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __it._M_current =
       (pIVar7->operands_).
       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
       super__Vector_impl_data._M_start;
  pOVar1 = (pIVar7->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)pOVar1 - (long)__it._M_current;
  local_a8 = this;
  for (lVar11 = lVar8 / 0x30 >> 2; _Var10._M_current = __it._M_current, 0 < lVar11;
      lVar11 = lVar11 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
            ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                          *)&rc,__it);
    if (bVar2) goto LAB_004f34bf;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
            ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                          *)&rc,__it._M_current + 1);
    _Var10._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_004f34bf;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
            ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                          *)&rc,__it._M_current + 2);
    _Var10._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_004f34bf;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
            ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                          *)&rc,__it._M_current + 3);
    _Var10._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_004f34bf;
    __it._M_current = __it._M_current + 4;
    lVar8 = lVar8 + -0xc0;
  }
  lVar8 = lVar8 / 0x30;
  if (lVar8 == 1) {
LAB_004f34a9:
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
            ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                          *)&rc,__it);
    _Var10._M_current = __it._M_current;
    if (!bVar2) {
      _Var10._M_current = pOVar1;
    }
LAB_004f34bf:
    if (_Var10._M_current == pOVar1) goto LAB_004f34d5;
  }
  else {
    if (lVar8 == 2) {
LAB_004f3494:
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
              ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                            *)&rc,__it);
      _Var10._M_current = __it._M_current;
      if (!bVar2) {
        __it._M_current = __it._M_current + 1;
        goto LAB_004f34a9;
      }
      goto LAB_004f34bf;
    }
    if (lVar8 == 3) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
              ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                            *)&rc,__it);
      if (!bVar2) {
        __it._M_current = __it._M_current + 1;
        goto LAB_004f3494;
      }
      goto LAB_004f34bf;
    }
LAB_004f34d5:
    iVar3 = (*type_00->_vptr_Type[10])(type_00);
    if ((CONCAT44(extraout_var,iVar3) != 0) ||
       (iVar3 = (*type_00->_vptr_Type[8])(type_00), CONCAT44(extraout_var_00,iVar3) != 0)) {
      pIVar5 = IRContext::get_instruction_folder((this->super_Pass).context_);
      uVar4 = InstructionFolder::FoldScalars(pIVar5,opcode,&operands);
      anon_unknown_14::EncodeIntegerAsWords((SmallVector<unsigned_int,_2UL> *)&rc,type_00,uVar4);
      pCVar6 = analysis::ConstantManager::
               GetConstant<spvtools::utils::SmallVector<unsigned_int,2ul>>
                         (this_00,type_00,(SmallVector<unsigned_int,_2UL> *)&rc);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&rc);
      pIVar7 = analysis::ConstantManager::BuildInstructionAndAddToModule(this_00,pCVar6,pos,0);
      goto LAB_004f355f;
    }
    iVar3 = (*type_00->_vptr_Type[0xe])(type_00);
    if (CONCAT44(extraout_var_01,iVar3) != 0) {
      iVar3 = (*type_00->_vptr_Type[0xe])(type_00);
      type = *(Type **)(CONCAT44(extraout_var_02,iVar3) + 0x28);
      iVar3 = (*type_00->_vptr_Type[0xe])(type_00);
      uVar4 = *(uint32_t *)(CONCAT44(extraout_var_03,iVar3) + 0x30);
      pIVar5 = IRContext::get_instruction_folder((this->super_Pass).context_);
      InstructionFolder::FoldVectors(&result_vec,pIVar5,opcode,uVar4,&operands);
      result_vector_components.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      result_vector_components.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      result_vector_components.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (puVar9 = result_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar9 != result_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish; puVar9 = puVar9 + 1) {
        anon_unknown_14::EncodeIntegerAsWords((SmallVector<unsigned_int,_2UL> *)&rc,type,*puVar9);
        pCVar6 = analysis::ConstantManager::
                 GetConstant<spvtools::utils::SmallVector<unsigned_int,2ul>>
                           (this_00,type,(SmallVector<unsigned_int,_2UL> *)&rc);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&rc);
        rc = pCVar6;
        if (pCVar6 == (Constant *)0x0) {
          __assert_fail("false && \"Failed to create constants with 32-bit word\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold_spec_constant_op_and_composite_pass.cpp"
                        ,0x13a,
                        "Instruction *spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(Module::inst_iterator *)"
                       );
        }
        std::
        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ::push_back(&result_vector_components,(value_type *)&rc);
        pIVar7 = analysis::ConstantManager::BuildInstructionAndAddToModule(this_00,rc,pos,0);
        if (pIVar7 == (Instruction *)0x0) {
          __assert_fail("false && \"Failed to build and insert constant declaring instruction \" \"for the given vector component constant\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold_spec_constant_op_and_composite_pass.cpp"
                        ,0x137,
                        "Instruction *spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(Module::inst_iterator *)"
                       );
        }
      }
      iVar3 = (*type_00->_vptr_Type[0xe])();
      local_50 = (Vector *)CONCAT44(extraout_var_04,iVar3);
      MakeUnique<spvtools::opt::analysis::VectorConstant,spvtools::opt::analysis::Vector_const*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                ((spvtools *)&rc,&local_50,&result_vector_components);
      local_b8._M_head_impl = rc;
      rc = (Constant *)0x0;
      pCVar6 = analysis::ConstantManager::RegisterConstant
                         (this_00,(unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
                                   *)&local_b8);
      if (local_b8._M_head_impl != (Constant *)0x0) {
        (*(local_b8._M_head_impl)->_vptr_Constant[1])();
      }
      local_b8._M_head_impl = (Constant *)0x0;
      pIVar7 = analysis::ConstantManager::BuildInstructionAndAddToModule(this_00,pCVar6,pos,0);
      if (rc != (Constant *)0x0) {
        (*rc->_vptr_Constant[1])();
      }
      std::
      _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ::~_Vector_base(&result_vector_components.
                       super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     );
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&result_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      goto LAB_004f355f;
    }
  }
  pIVar7 = (Instruction *)0x0;
LAB_004f355f:
  std::
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::~_Vector_base(&operands.
                   super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                 );
  return pIVar7;
}

Assistant:

Instruction* FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(
    Module::inst_iterator* pos) {
  const Instruction* inst = &**pos;
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  const analysis::Type* result_type = const_mgr->GetType(inst);
  spv::Op spec_opcode = static_cast<spv::Op>(inst->GetSingleWordInOperand(0));
  // Check and collect operands.
  std::vector<const analysis::Constant*> operands;

  if (!std::all_of(
          inst->cbegin(), inst->cend(), [&operands, this](const Operand& o) {
            // skip the operands that is not an id.
            if (o.type != spv_operand_type_t::SPV_OPERAND_TYPE_ID) return true;
            uint32_t id = o.words.front();
            if (auto c =
                    context()->get_constant_mgr()->FindDeclaredConstant(id)) {
              if (IsValidTypeForComponentWiseOperation(c->type())) {
                operands.push_back(c);
                return true;
              }
            }
            return false;
          }))
    return nullptr;

  if (result_type->AsInteger() || result_type->AsBool()) {
    // Scalar operation
    const uint32_t result_val =
        context()->get_instruction_folder().FoldScalars(spec_opcode, operands);
    auto result_const = const_mgr->GetConstant(
        result_type, EncodeIntegerAsWords(*result_type, result_val));
    return const_mgr->BuildInstructionAndAddToModule(result_const, pos);
  } else if (result_type->AsVector()) {
    // Vector operation
    const analysis::Type* element_type =
        result_type->AsVector()->element_type();
    uint32_t num_dims = result_type->AsVector()->element_count();
    std::vector<uint32_t> result_vec =
        context()->get_instruction_folder().FoldVectors(spec_opcode, num_dims,
                                                        operands);
    std::vector<const analysis::Constant*> result_vector_components;
    for (const uint32_t r : result_vec) {
      if (auto rc = const_mgr->GetConstant(
              element_type, EncodeIntegerAsWords(*element_type, r))) {
        result_vector_components.push_back(rc);
        if (!const_mgr->BuildInstructionAndAddToModule(rc, pos)) {
          assert(false &&
                 "Failed to build and insert constant declaring instruction "
                 "for the given vector component constant");
        }
      } else {
        assert(false && "Failed to create constants with 32-bit word");
      }
    }
    auto new_vec_const = MakeUnique<analysis::VectorConstant>(
        result_type->AsVector(), result_vector_components);
    auto reg_vec_const = const_mgr->RegisterConstant(std::move(new_vec_const));
    return const_mgr->BuildInstructionAndAddToModule(reg_vec_const, pos);
  } else {
    // Cannot process invalid component wise operation. The result of component
    // wise operation must be of integer or bool scalar or vector of
    // integer/bool type.
    return nullptr;
  }
}